

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicFenceTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiFenceCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkResult VVar1;
  int iVar2;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar3;
  long lVar4;
  allocator<char> local_169;
  string local_168;
  VkFence fence [2];
  VkSubmitInfo submitInfo;
  RefBase<vk::VkCommandBuffer_s_*> local_e8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_c8;
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  VkFenceCreateInfo fenceInfo;
  VkCommandBufferBeginInfo info;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar3 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_c8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_c8.m_data.object.m_internal = submitInfo._0_8_;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  makeCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,
                    (VkCommandPool)local_c8.m_data.object.m_internal);
  local_e8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_e8.m_data.deleter.m_pool.m_internal = (deUint64)submitInfo.pWaitSemaphores;
  local_e8.m_data.object = (VkCommandBuffer_s *)submitInfo._0_8_;
  local_e8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&submitInfo);
  fenceInfo.flags = 0;
  fenceInfo._20_4_ = 0;
  fenceInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceInfo._4_4_ = 0;
  fenceInfo.pNext = (void *)0x0;
  ::vk::createFence(ptrFence,vk,device,&fenceInfo,(VkAllocationCallbacks *)0x0);
  ::vk::createFence(ptrFence + 1,vk,device,&fenceInfo,(VkAllocationCallbacks *)0x0);
  fence[0].m_internal =
       ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  fence[1].m_internal =
       ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&local_e8;
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_e8.m_data.object);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*cmdBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8a);
  endCommandBuffer(vk,local_e8.m_data.object);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo,fence[0].m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8d);
  iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,fence,0,0xffffffffffffffff);
  if (iVar2 == 0) {
    iVar2 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,fence);
    if (iVar2 == 0) {
      VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo,fence[0].m_internal);
      ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                        ,0x95);
      iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,fence,1,1000);
      if (iVar2 == 2) {
        VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo,fence[1].m_internal);
        ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                          ,0x9a);
        iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,fence,1,0xffffffffffffffff);
        if (iVar2 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,"Basic multi fence tests passed",&local_169);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_168);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_168,"vkWaitForFences should return VK_SUCCESS",&local_169);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"vkWaitForFences should return VK_TIMEOUT",&local_169);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"Couldn\'t reset the fence",&local_169);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"vkWaitForFences should return VK_SUCCESS",&local_169);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_168);
  }
  std::__cxx11::string::~string((string *)&local_168);
  lVar4 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
               ((long)&ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                       m_internal + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus basicMultiFenceCase (Context& context)
{
	enum{FISRT_FENCE=0,SECOND_FENCE};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,  queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkFenceCreateInfo			fenceInfo			=
														{
															VK_STRUCTURE_TYPE_FENCE_CREATE_INFO, // VkStructureType		sType;
															DE_NULL,							 // const void*			pNext;
															0u,									 // VkFenceCreateFlags	flags;
														};
	const Move<VkFence>				ptrFence[2]			= { createFence(vk, device, &fenceInfo), createFence(vk, device, &fenceInfo) };
	const VkFence					fence[2]			= { *ptrFence[FISRT_FENCE], *ptrFence[SECOND_FENCE] };
	const VkCommandBufferBeginInfo	info				=
														{
															VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
															DE_NULL,										// const void*                              pNext;
															VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
															DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
														};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
															DE_NULL,							// const void*				pNext;
															0u,									// deUint32					waitSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
															(const VkPipelineStageFlags*)DE_NULL,
															1u,									// deUint32					commandBufferCount;
															&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
															0u,									// deUint32					signalSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pSignalSemaphores;
														};


	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &info));
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence[FISRT_FENCE], DE_FALSE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	if (VK_SUCCESS != vk.resetFences(device, 1u, &fence[FISRT_FENCE]))
		return tcu::TestStatus::fail("Couldn't reset the fence");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_TIMEOUT != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_TIMEOUT");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	return tcu::TestStatus::pass("Basic multi fence tests passed");
}